

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * TEST_late_unknown_options_no_fail(void)

{
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  char **ppcVar4;
  char *pcVar5;
  undefined8 *puVar6;
  ulong uVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  int b;
  int a;
  cargo_t cargo;
  size_t unknown_count_cpy;
  char **unknowns_cpy;
  char *args [7];
  uint local_88;
  uint local_84;
  cargo_t local_80;
  size_t local_78;
  char **local_70;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  iVar3 = cargo_init(&local_80,0,"program");
  if (iVar3 == 0) {
    local_38 = "3";
    local_48 = "--delta";
    pcStack_40 = "--beta";
    local_58 = "123";
    pcStack_50 = "--centauri";
    local_68 = 0x12aaaa;
    uStack_64 = 0;
    uStack_60 = 0x127dbd;
    uStack_5c = 0;
    local_84 = 0;
    local_88 = 0;
    local_70 = (char **)0x0;
    local_78 = 0;
    if (local_80 == (cargo_t)0x0) {
      __assert_fail("ctx",
                    "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                    ,0x127d,"void cargo_set_flags(cargo_t, cargo_flags_t)");
    }
    local_80->flags = CARGO_NO_FAIL_UNKNOWN;
    cargo_add_option(local_80,0,"--alpha","an option","i",&local_84);
    iVar3 = cargo_add_option(local_80,0,"--beta -b","an option","i",&local_88);
    if (iVar3 == 0) {
      iVar3 = cargo_parse(local_80,0,1,7,(char **)&local_68);
      if (iVar3 == 0) {
        printf("a = %d\n",(ulong)local_84);
        printf("b = %d\n",(ulong)local_88);
        if (local_84 == 0x7b) {
          if (local_88 == 3) {
            if (local_80 == (cargo_t)0x0) {
              __assert_fail("ctx",
                            "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                            ,0x14ff,"const char **cargo_get_unknown(cargo_t, size_t *)");
            }
            ppcVar4 = local_80->unknown_opts;
            if (ppcVar4 == (char **)0x0) {
              pcVar5 = "Got NULL unknowns list";
            }
            else {
              sVar1 = local_80->unknown_opts_count;
              if (sVar1 == 0) {
                puts("Check that \"unknowns\" has expected_count elements");
              }
              else {
                sVar8 = 0;
                do {
                  puts(ppcVar4[sVar8]);
                  sVar8 = sVar8 + 1;
                } while (sVar1 != sVar8);
                puts("Check that \"unknowns\" has expected_count elements");
                if (sVar1 == 2) {
                  lVar10 = 1;
                  puVar6 = &DAT_001327c0;
                  uVar9 = 0;
                  pcVar5 = "Array contains unexpected value";
LAB_0011d017:
                  if (lVar10 != 3) goto code_r0x0011d021;
                  ppcVar4 = cargo_get_unknown_copy(local_80,&local_78);
                  local_70 = ppcVar4;
                  if (ppcVar4 == (char **)0x0) {
                    pcVar5 = "Got NULL unknowns list (copy)";
                    uVar9 = local_78;
                  }
                  else {
                    if (local_78 != 0) {
                      uVar9 = 0;
                      do {
                        puts(ppcVar4[uVar9]);
                        uVar9 = uVar9 + 1;
                      } while (uVar9 < local_78);
                    }
                    puts("Check that \"unknowns_cpy\" has expected_count elements");
                    if (local_78 == 2) {
                      puVar6 = &DAT_001327c0;
                      uVar7 = 0;
                      do {
                        if (local_78 <= uVar7) {
                          pcVar5 = (char *)0x0;
                          uVar9 = local_78;
                          break;
                        }
                        pcVar2 = (char *)*puVar6;
                        printf("  %lu: \"%s\" -> \"%s\"\n",uVar7 + 1,ppcVar4[uVar7],pcVar2);
                        iVar3 = strcmp(ppcVar4[uVar7],pcVar2);
                        puVar6 = puVar6 + 1;
                        uVar7 = uVar7 + 1;
                        uVar9 = local_78;
                      } while (iVar3 == 0);
                    }
                    else {
                      pcVar5 = 
                      "unknowns_cpy array count unknown_count_cpy is not expected expected_count";
                      uVar9 = local_78;
                    }
                  }
                  goto LAB_0011d089;
                }
              }
              pcVar5 = "unknowns array count unknown_count is not expected expected_count";
            }
          }
          else {
            pcVar5 = "b != 3 after unknown option (check after)";
          }
          uVar9 = 0;
        }
        else {
          pcVar5 = "a != 123 after unknown option (check after)";
          uVar9 = 0;
        }
      }
      else {
        pcVar5 = "Parse failure on unknown option (late, no fail)";
        uVar9 = 0;
      }
    }
    else {
      pcVar5 = "Failed to add options";
      uVar9 = 0;
    }
LAB_0011d089:
    cargo_free_commandline(&local_70,(int)uVar9);
    cargo_destroy(&local_80);
  }
  else {
    pcVar5 = "Failed to init cargo";
  }
  return pcVar5;
code_r0x0011d021:
  pcVar2 = (char *)*puVar6;
  printf("  %lu: \"%s\" -> \"%s\"\n",lVar10,ppcVar4[lVar10 + -1],pcVar2);
  iVar3 = strcmp(ppcVar4[lVar10 + -1],pcVar2);
  lVar10 = lVar10 + 1;
  puVar6 = puVar6 + 1;
  if (iVar3 != 0) goto LAB_0011d089;
  goto LAB_0011d017;
}

Assistant:

_TEST_START(TEST_late_unknown_options_no_fail)
{
    char *args[] =
    {
        "program", "--alpha", "123", "--centauri", "--delta", "--beta", "3"
    };
    char *expected[] = { "--centauri", "--delta" };
    size_t expected_count = sizeof(expected) / sizeof(expected[0]);
    int a = 0;
    int b = 0;
    size_t i = 0;
    const char **unknowns = NULL;
    size_t unknown_count = 0;
    char **unknowns_cpy = NULL;
    size_t unknown_count_cpy = 0;

    cargo_set_flags(cargo, CARGO_NO_FAIL_UNKNOWN);

    ret = cargo_add_option(cargo, 0, "--alpha", "an option", "i", &a);
    ret = cargo_add_option(cargo, 0, "--beta -b", "an option", "i", &b);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    cargo_assert(ret == 0, "Parse failure on unknown option (late, no fail)");

    printf("a = %d\n", a);
    printf("b = %d\n", b);
    cargo_assert(a == 123, "a != 123 after unknown option (check after)");
    cargo_assert(b == 3,   "b != 3 after unknown option (check after)");

    unknowns = cargo_get_unknown(cargo, &unknown_count);
    cargo_assert(unknowns, "Got NULL unknowns list");
    for (i = 0; i < unknown_count; i++) printf("%s\n", unknowns[i]);
    cargo_assert_str_array(unknown_count, expected_count, unknowns, expected);

    unknowns_cpy = cargo_get_unknown_copy(cargo, &unknown_count_cpy);
    cargo_assert(unknowns_cpy, "Got NULL unknowns list (copy)");
    for (i = 0; i < unknown_count_cpy; i++) printf("%s\n", unknowns_cpy[i]);
    cargo_assert_str_array(unknown_count_cpy, expected_count, unknowns_cpy, expected);

    _TEST_CLEANUP();
    cargo_free_commandline(&unknowns_cpy, unknown_count_cpy);
}